

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O0

void testEraseAttribute(string *name)

{
  bool bVar1;
  ConstIterator *this;
  Header header;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  ConstIterator *in_stack_ffffffffffffff30;
  Vec2<float> local_48;
  Header local_40 [64];
  
  Imath_3_2::Vec2<float>::Vec2(&local_48,0.0,0.0);
  Imf_3_4::Header::Header(local_40,0x40,0x40,1.0,(Vec2 *)&local_48,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_4::Header::find((string *)local_40);
  Imf_3_4::Header::ConstIterator::ConstIterator
            (in_stack_ffffffffffffff30,
             (Iterator *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  Imf_3_4::Header::end();
  Imf_3_4::Header::ConstIterator::ConstIterator
            (in_stack_ffffffffffffff30,
             (Iterator *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  bVar1 = Imf_3_4::operator!=(in_stack_ffffffffffffff30,
                              (ConstIterator *)
                              CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  if (!bVar1) {
    __assert_fail("header.find (name) != header.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                  ,0x41,"void testEraseAttribute(const string &)");
  }
  Imf_3_4::Header::erase((string *)local_40);
  Imf_3_4::Header::find((string *)local_40);
  Imf_3_4::Header::ConstIterator::ConstIterator
            (in_stack_ffffffffffffff30,
             (Iterator *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  this = (ConstIterator *)Imf_3_4::Header::end();
  Imf_3_4::Header::ConstIterator::ConstIterator
            (this,(Iterator *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  bVar1 = Imf_3_4::operator==(this,(ConstIterator *)
                                   CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  if (!bVar1) {
    __assert_fail("header.find (name) == header.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                  ,0x43,"void testEraseAttribute(const string &)");
  }
  Imf_3_4::Header::~Header(local_40);
  return;
}

Assistant:

void
testEraseAttribute (const string& name)
{
    Header header;
    assert (header.find (name) != header.end ());
    header.erase (name);
    assert (header.find (name) == header.end ());
}